

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DoSetMaster(AActor *self,AActor *master)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ActorFlags *pAVar4;
  TObjPtr<AActor> *pTVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  undefined1 local_58 [4];
  TFlags<ActorFlag,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  AActor *local_48;
  AActor *attacker;
  TFlags<ActorFlag,_unsigned_int> local_38;
  TFlags<ActorFlag,_unsigned_int> local_34;
  TFlags<ActorFlag3,_unsigned_int> local_30;
  TFlags<ActorFlag3,_unsigned_int> local_2c;
  AActor *local_28;
  AActor *defs;
  AActor *master_local;
  AActor *self_local;
  
  defs = master;
  master_local = self;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_2c,(int)self + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
            );
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
  if (uVar2 != 0) {
    if (defs == (AActor *)0x0) {
      TObjPtr<AActor>::operator=(&master_local->master,(AActor *)0x0);
      master_local->FriendPlayer = '\0';
      local_28 = AActor::GetDefault(master_local);
      bVar1 = AActor::CountsAsKill(master_local);
      level.total_monsters = level.total_monsters - (uint)bVar1;
      pAVar4 = &master_local->flags;
      operator~((EnumType)local_58);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_54,pAVar4);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_5c,
                 (int)local_28 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_50,&local_54);
      TFlags<ActorFlag,_unsigned_int>::operator=(&master_local->flags,&local_50);
      bVar1 = AActor::CountsAsKill(master_local);
      level.total_monsters = (uint)bVar1 + level.total_monsters;
      pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->target);
      pAVar6 = master_local;
      if (pAVar7 != (AActor *)0x0) {
        pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->target);
        bVar1 = AActor::IsHostile(pAVar6,pAVar7);
        if (!bVar1) {
          TObjPtr<AActor>::operator=(&master_local->target,(AActor *)0x0);
        }
      }
      pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->lastenemy);
      pAVar6 = master_local;
      if (pAVar7 != (AActor *)0x0) {
        pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->lastenemy);
        bVar1 = AActor::IsHostile(pAVar6,pAVar7);
        if (!bVar1) {
          TObjPtr<AActor>::operator=(&master_local->lastenemy,(AActor *)0x0);
        }
      }
      pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->LastHeard);
      pAVar6 = master_local;
      if (pAVar7 != (AActor *)0x0) {
        pAVar7 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->LastHeard);
        bVar1 = AActor::IsHostile(pAVar6,pAVar7);
        if (!bVar1) {
          TObjPtr<AActor>::operator=(&master_local->LastHeard,(AActor *)0x0);
        }
      }
      return 1;
    }
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_30,
               (int)defs + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
    if (uVar2 != 0) {
      master_local->FriendPlayer = '\0';
      TObjPtr<AActor>::operator=(&master_local->master,defs);
      bVar1 = AActor::CountsAsKill(master_local);
      level.total_monsters = level.total_monsters - (uint)bVar1;
      pAVar4 = &master_local->flags;
      operator~((int)&attacker + MF_SHOOTABLE);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_38,pAVar4);
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&attacker,
                 (int)defs + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_34,&local_38);
      TFlags<ActorFlag,_unsigned_int>::operator=(&master_local->flags,&local_34);
      bVar1 = AActor::CountsAsKill(master_local);
      level.total_monsters = (uint)bVar1 + level.total_monsters;
      pTVar5 = &master_local->target;
      pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->master);
      bVar1 = TObjPtr<AActor>::operator==(pTVar5,pAVar6);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->target,(AActor *)0x0);
      }
      pTVar5 = &master_local->lastenemy;
      pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->master);
      bVar1 = TObjPtr<AActor>::operator==(pTVar5,pAVar6);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->lastenemy,(AActor *)0x0);
      }
      pTVar5 = &master_local->LastHeard;
      pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&master_local->master);
      bVar1 = TObjPtr<AActor>::operator==(pTVar5,pAVar6);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->LastHeard,(AActor *)0x0);
      }
      return 1;
    }
    if (defs->player != (player_t *)0x0) {
      TObjPtr<AActor>::operator=(&master_local->master,(AActor *)0x0);
      bVar1 = AActor::CountsAsKill(master_local);
      level.total_monsters = level.total_monsters - (uint)bVar1;
      TFlags<ActorFlag,_unsigned_int>::operator|=(&master_local->flags,MF_FRIENDLY);
      AActor::SetFriendPlayer(master_local,defs->player);
      local_48 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&defs->player->attacker);
      if (local_48 != (AActor *)0x0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_4c,
                   (int)local_48 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
        bVar1 = true;
        if (uVar2 != 0) {
          iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
          bVar1 = false;
          if ((iVar3 != 0) && (bVar1 = false, local_48->FriendPlayer != '\0')) {
            bVar1 = local_48->FriendPlayer != master_local->FriendPlayer;
          }
        }
        if (bVar1) {
          pAVar6 = TObjPtr<AActor>::operator=(&master_local->target,local_48);
          TObjPtr<AActor>::operator=(&master_local->LastHeard,pAVar6);
        }
      }
      bVar1 = TObjPtr<AActor>::operator==(&master_local->target,defs);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->target,(AActor *)0x0);
      }
      bVar1 = TObjPtr<AActor>::operator==(&master_local->lastenemy,defs);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->lastenemy,(AActor *)0x0);
      }
      bVar1 = TObjPtr<AActor>::operator==(&master_local->LastHeard,defs);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&master_local->LastHeard,(AActor *)0x0);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int DoSetMaster (AActor *self, AActor *master)
{
    AActor *defs;
    if (self->flags3&MF3_ISMONSTER)
    {
        if (master)
        {
            if (master->flags3&MF3_ISMONSTER)
            {
                self->FriendPlayer = 0;
                self->master = master;
                level.total_monsters -= self->CountsAsKill();
                self->flags = (self->flags & ~MF_FRIENDLY) | (master->flags & MF_FRIENDLY);
                level.total_monsters += self->CountsAsKill();
                // Don't attack your new master
                if (self->target == self->master) self->target = NULL;
                if (self->lastenemy == self->master) self->lastenemy = NULL;
                if (self->LastHeard == self->master) self->LastHeard = NULL;
                return 1;
            }
            else if (master->player)
            {
                // [KS] Be friendly to this player
                self->master = NULL;
                level.total_monsters -= self->CountsAsKill();
                self->flags|=MF_FRIENDLY;
                self->SetFriendPlayer(master->player);

                AActor * attacker=master->player->attacker;
                if (attacker)
                {
                    if (!(attacker->flags&MF_FRIENDLY) || 
                        (deathmatch && attacker->FriendPlayer!=0 && attacker->FriendPlayer!=self->FriendPlayer))
                    {
                        self->LastHeard = self->target = attacker;
                    }
                }
                // And stop attacking him if necessary.
                if (self->target == master) self->target = NULL;
                if (self->lastenemy == master) self->lastenemy = NULL;
                if (self->LastHeard == master) self->LastHeard = NULL;
                return 1;
            }
        }
        else
        {
            self->master = NULL;
            self->FriendPlayer = 0;
            // Go back to whatever friendliness we usually have...
            defs = self->GetDefault();
            level.total_monsters -= self->CountsAsKill();
            self->flags = (self->flags & ~MF_FRIENDLY) | (defs->flags & MF_FRIENDLY);
            level.total_monsters += self->CountsAsKill();
            // ...And re-side with our friends.
            if (self->target && !self->IsHostile (self->target)) self->target = NULL;
            if (self->lastenemy && !self->IsHostile (self->lastenemy)) self->lastenemy = NULL;
            if (self->LastHeard && !self->IsHostile (self->LastHeard)) self->LastHeard = NULL;
            return 1;
        }
    }
    return 0;
}